

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

RTQuaternion * __thiscall RTQuaternion::operator*=(RTQuaternion *this,RTQuaternion *qb)

{
  RTFLOAT RVar1;
  RTFLOAT RVar2;
  RTFLOAT RVar3;
  RTFLOAT RVar4;
  RTFLOAT RVar5;
  RTFLOAT RVar6;
  RTFLOAT RVar7;
  RTFLOAT RVar8;
  undefined1 local_28 [8];
  RTQuaternion qa;
  RTQuaternion *qb_local;
  RTQuaternion *this_local;
  
  qa.m_data._8_8_ = qb;
  RTQuaternion((RTQuaternion *)local_28);
  operator=((RTQuaternion *)local_28,this);
  RVar1 = scalar((RTQuaternion *)local_28);
  RVar2 = scalar((RTQuaternion *)qa.m_data._8_8_);
  RVar3 = x((RTQuaternion *)local_28);
  RVar4 = x((RTQuaternion *)qa.m_data._8_8_);
  RVar5 = y((RTQuaternion *)local_28);
  RVar6 = y((RTQuaternion *)qa.m_data._8_8_);
  RVar7 = z((RTQuaternion *)local_28);
  RVar8 = z((RTQuaternion *)qa.m_data._8_8_);
  this->m_data[0] = -RVar7 * RVar8 + -RVar5 * RVar6 + RVar1 * RVar2 + -(RVar3 * RVar4);
  RVar1 = scalar((RTQuaternion *)local_28);
  RVar2 = x((RTQuaternion *)qa.m_data._8_8_);
  RVar3 = x((RTQuaternion *)local_28);
  RVar4 = scalar((RTQuaternion *)qa.m_data._8_8_);
  RVar5 = y((RTQuaternion *)local_28);
  RVar6 = z((RTQuaternion *)qa.m_data._8_8_);
  RVar7 = z((RTQuaternion *)local_28);
  RVar8 = y((RTQuaternion *)qa.m_data._8_8_);
  this->m_data[1] = -RVar7 * RVar8 + RVar5 * RVar6 + RVar1 * RVar2 + RVar3 * RVar4;
  RVar1 = scalar((RTQuaternion *)local_28);
  RVar2 = y((RTQuaternion *)qa.m_data._8_8_);
  RVar3 = x((RTQuaternion *)local_28);
  RVar4 = z((RTQuaternion *)qa.m_data._8_8_);
  RVar5 = y((RTQuaternion *)local_28);
  RVar6 = scalar((RTQuaternion *)qa.m_data._8_8_);
  RVar7 = z((RTQuaternion *)local_28);
  RVar8 = x((RTQuaternion *)qa.m_data._8_8_);
  this->m_data[2] = RVar7 * RVar8 + RVar5 * RVar6 + RVar1 * RVar2 + -(RVar3 * RVar4);
  RVar1 = scalar((RTQuaternion *)local_28);
  RVar2 = z((RTQuaternion *)qa.m_data._8_8_);
  RVar3 = x((RTQuaternion *)local_28);
  RVar4 = y((RTQuaternion *)qa.m_data._8_8_);
  RVar5 = y((RTQuaternion *)local_28);
  RVar6 = x((RTQuaternion *)qa.m_data._8_8_);
  RVar7 = z((RTQuaternion *)local_28);
  RVar8 = scalar((RTQuaternion *)qa.m_data._8_8_);
  this->m_data[3] = RVar7 * RVar8 + -RVar5 * RVar6 + RVar1 * RVar2 + RVar3 * RVar4;
  return this;
}

Assistant:

RTQuaternion& RTQuaternion::operator *=(const RTQuaternion& qb)
{
    RTQuaternion qa;

    qa = *this;

    m_data[0] = qa.scalar() * qb.scalar() - qa.x() * qb.x() - qa.y() * qb.y() - qa.z() * qb.z();
    m_data[1] = qa.scalar() * qb.x() + qa.x() * qb.scalar() + qa.y() * qb.z() - qa.z() * qb.y();
    m_data[2] = qa.scalar() * qb.y() - qa.x() * qb.z() + qa.y() * qb.scalar() + qa.z() * qb.x();
    m_data[3] = qa.scalar() * qb.z() + qa.x() * qb.y() - qa.y() * qb.x() + qa.z() * qb.scalar();

    return *this;
}